

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpEventServer.cpp
# Opt level: O1

void __thiscall ConnQueue::ConnQueue(ConnQueue *this)

{
  Conn *pCVar1;
  Conn *pCVar2;
  
  pCVar1 = (Conn *)operator_new(0x30);
  pCVar1->m_fd = 0;
  pCVar1->m_Prev = (Conn *)0x0;
  pCVar1->m_Next = (Conn *)0x0;
  this->m_head = pCVar1;
  pCVar2 = (Conn *)operator_new(0x30);
  pCVar2->m_fd = 0;
  pCVar2->m_Prev = (Conn *)0x0;
  pCVar2->m_Next = (Conn *)0x0;
  this->m_tail = pCVar2;
  pCVar2->m_Next = (Conn *)0x0;
  pCVar1->m_Prev = (Conn *)0x0;
  pCVar1->m_Next = pCVar2;
  pCVar2->m_Prev = pCVar1;
  return;
}

Assistant:

ConnQueue::ConnQueue()
{
    //建立头尾结点，并调整其指针
    m_head = new Conn(0);
    m_tail = new Conn(0);
    m_head->m_Prev = m_tail->m_Next = NULL;
    m_head->m_Next = m_tail;
    m_tail->m_Prev = m_head;
}